

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHash<SubArray,Macro>::emplace<Macro_const&>(QHash<SubArray,Macro> *this,SubArray *key,Macro *args)

{
  Data *pDVar1;
  long in_FS_OFFSET;
  piter pVar2;
  Macro local_60;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data **)this;
  if (pDVar1 == (Data *)0x0) {
    local_60._0_8_ = (Data *)0x0;
LAB_0011abda:
    QHash<SubArray,_Macro>::detach((QHash<SubArray,_Macro> *)this);
    pVar2 = (piter)emplace_helper<Macro_const&>(this,key,args);
    QHash<SubArray,_Macro>::~QHash((QHash<SubArray,_Macro> *)&local_60);
  }
  else {
    if (1 < *(uint *)&pDVar1->ref) {
      local_60._0_8_ = pDVar1;
      if (*(uint *)&pDVar1->ref != 0xffffffff) {
        LOCK();
        pDVar1->ref = (RefCount)(*(uint *)&pDVar1->ref + 1);
        UNLOCK();
      }
      goto LAB_0011abda;
    }
    if (pDVar1->size < pDVar1->numBuckets >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        pVar2 = (piter)emplace_helper<Macro_const&>(this,key,args);
        return (iterator)pVar2;
      }
      goto LAB_0011ac50;
    }
    Macro::Macro(&local_60,args);
    pVar2 = (piter)QHash<SubArray,_Macro>::emplace_helper<Macro>
                             ((QHash<SubArray,_Macro> *)this,key,&local_60);
    Macro::~Macro(&local_60);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (iterator)pVar2;
  }
LAB_0011ac50:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }